

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O1

void cursespp::SchemaOverlay::ShowEnumOverlay
               (EnumEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  int precision;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  double value;
  uint __val;
  PrefsPtr *pPVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  _func_void *p_Var7;
  runtime_error *this_00;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint __len;
  DoubleEntry *doubleEntry;
  string __str;
  anon_class_80_3_1ce9ae6c handler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string name;
  allocator<char> local_14a;
  allocator<char> local_149;
  string local_148;
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  long local_c8 [2];
  _Any_data local_b8;
  code *local_a8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_60;
  PrefsPtr *local_58;
  string local_50;
  
  local_60 = callback;
  local_58 = prefs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(entry->entry).name,(allocator<char> *)local_e8);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (entry->count != 0) {
    uVar9 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,entry->values[uVar9],(allocator<char> *)local_128);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < entry->count);
  }
  pPVar3 = local_58;
  local_e8._0_8_ =
       (local_58->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8._8_8_ =
       (local_58->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
    }
  }
  local_d8._M_allocated_capacity = (size_type)local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_e8 + 0x10),local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_b8,local_60);
  peVar2 = (pPVar3->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (pPVar3->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
  }
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,(entry->entry).name,&local_149);
  switch(TVar1) {
  case Bool:
    bVar5 = (**(code **)(*(long *)peVar2 + 0x50))(peVar2,local_108,(char)entry->count);
    pcVar10 = "false";
    if (bVar5 != 0) {
      pcVar10 = "true";
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,pcVar10,pcVar10 + ((ulong)bVar5 ^ 5));
    break;
  case Int:
    uVar6 = (**(code **)(*(long *)peVar2 + 0x58))(peVar2,local_108,*(undefined4 *)&entry->values);
    __val = -uVar6;
    if (0 < (int)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_0017703c;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_0017703c;
        }
        if (uVar8 < 10000) goto LAB_0017703c;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_0017703c:
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_148,(char)__len - (char)((int)uVar6 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_148._M_dataplus._M_p + (uVar6 >> 0x1f),__len,__val);
    break;
  case Double:
    precision = *(int *)&entry->defaultValue;
    value = (double)(**(code **)(*(long *)peVar2 + 0x60))
                              ((int)*(undefined8 *)&entry[1].entry,peVar2,local_108);
    stringValueForDouble_abi_cxx11_(&local_148,value,precision);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,(char *)entry->count,&local_14a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_148,peVar2,local_108,local_128);
    goto LAB_00176fa7;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,entry->defaultValue,&local_14a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_148,peVar2,local_108,local_128);
LAB_00176fa7:
    if (local_128[0] != local_118) {
      operator_delete(local_128[0],local_118[0] + 1);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type passed to stringValueFor!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var7 = (_func_void *)operator_new(0x50);
  *(undefined8 *)p_Var7 = local_e8._0_8_;
  *(undefined8 *)(p_Var7 + 8) = local_e8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
    }
  }
  *(_func_void **)(p_Var7 + 0x10) = p_Var7 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var7 + 0x10),local_d8._M_allocated_capacity,
             local_d8._8_8_ + local_d8._M_allocated_capacity);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(p_Var7 + 0x30),
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_b8);
  pcStack_80 = std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:386:20)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:386:20)>
             ::_M_manager;
  local_98._M_unused._M_function_pointer = p_Var7;
  ShowListOverlay(&local_50,&local_78,&local_148,
                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((long *)local_d8._M_allocated_capacity != local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,local_c8[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowEnumOverlay(
    const ISchema::EnumEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);
    std::vector<std::string> items;

    for (size_t i = 0; i < entry->count; i++) {
        items.push_back(entry->values[i]);
    }

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetString(name, value.c_str());
        if (callback) { callback(value); }
    };

    ShowListOverlay(name, items, stringValueFor(prefs, entry), handler);
}